

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nocpout.c
# Opt level: O2

Symbol * breakpoint_current(Symbol *s)

{
  List *pLVar1;
  
  pLVar1 = breakpoint_local_current_;
  if (breakpoint_local_current_ != (List *)0x0) {
    do {
      pLVar1 = pLVar1->next;
      if (pLVar1 == breakpoint_local_current_) {
        return s;
      }
    } while ((Symbol *)(pLVar1->element).itm != s);
    s = (Symbol *)(pLVar1->next->element).itm;
  }
  return s;
}

Assistant:

Symbol* breakpoint_current(Symbol* s) {
	if (breakpoint_local_current_) {
		Item* q;
		ITERATE(q, breakpoint_local_current_) {
			if (SYM(q) == s) {
				return SYM(q->next);
			}
		}
	}
	return s;
}